

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_raster.cpp
# Opt level: O0

void __thiscall
QRasterPlatformPixmap::fromImageReader
          (QRasterPlatformPixmap *this,QImageReader *imageReader,ImageConversionFlags flags)

{
  bool bVar1;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QImage image;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QImage *in_stack_ffffffffffffffc0;
  QRasterPlatformPixmap *in_stack_ffffffffffffffc8;
  undefined1 local_28 [16];
  QImageData *local_18;
  undefined4 local_c;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = SUB84(in_RDX,0);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  QImageReader::read((QImageReader *)local_28,in_ESI,in_RDX,in_RCX);
  bVar1 = QImage::isNull((QImage *)local_28);
  if (!bVar1) {
    QImage::QImage((QImage *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
    createPixmapForImage
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               (QFlagsStorageHelper<Qt::ImageConversionFlag,_4>)SUB84((ulong)lVar2 >> 0x20,0));
    QImage::~QImage((QImage *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  QImage::~QImage((QImage *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffa0));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRasterPlatformPixmap::fromImageReader(QImageReader *imageReader,
                                        Qt::ImageConversionFlags flags)
{
    Q_UNUSED(flags);
    QImage image = imageReader->read();
    if (image.isNull())
        return;

    createPixmapForImage(std::move(image), flags);
}